

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O1

void massagekinetic(Item *q1,Item *q2,Item *q3,Item *q4,int sensused)

{
  byte *pbVar1;
  Symbol *pSVar2;
  Item *pIVar3;
  Symbol *pSVar4;
  Item *pIVar5;
  Item *q1_00;
  int iVar6;
  Item *pIVar7;
  long lVar8;
  Reaction *pRVar9;
  Reaction *pRVar10;
  Rlist *pRVar11;
  Symbol **ppSVar12;
  char **ppcVar13;
  List *pLVar14;
  char *pcVar15;
  Rterm *pRVar16;
  ulong uVar17;
  List *pLVar18;
  Item *pIVar19;
  int array_length;
  uint uVar20;
  char buf1 [8192];
  char local_2038 [8200];
  
  pSVar2 = (q2->element).sym;
  if (((pSVar2->subtype & 0x600) != 0) && ((pSVar2->u).i != 0)) {
    diag("Merging kinetic blocks not implemented",(char *)0x0);
  }
  pbVar1 = (byte *)((long)&pSVar2->subtype + 1);
  *pbVar1 = *pbVar1 | 4;
  numlist = numlist + 1;
  (pSVar2->u).i = numlist;
  sprintf(buf,"\n/* _kinetic_ %s %s */\n#ifndef INSIDE_NMODL\n#define INSIDE_NMODL\n#endif\n",
          ((q2->element).sym)->name,suffix);
  linsertstr(procfunc,buf);
  sprintf(buf,
          "\ntemplate <coreneuron::scopmath::enabled_code code_to_enable = coreneuron::scopmath::enabled_code::all>\nstruct %s%s {\n  int operator()(SparseObj* _so, double* _rhs, _threadargsproto_) const;\n};\ntemplate <coreneuron::scopmath::enabled_code code_to_enable>\nint"
          ,((q2->element).sym)->name,suffix);
  replacstr(q1,buf);
  sprintf(buf,"%s%s<code_to_enable>::operator()",((q2->element).sym)->name,suffix);
  replacstr(q2,buf);
  pIVar7 = insertstr(q3,"()\n");
  if (vectorize != 0) {
    kin_vect1(q1,q2,q4);
    vectorize_substitute(pIVar7,"(SparseObj* _so, double* _rhs, _threadargsproto_) const\n");
  }
  pIVar7 = insertstr(q3,"{_reset=0;\n");
  builtin_strncpy(buf,"{int _reset=0;\n",0x10);
  vectorize_substitute(pIVar7,buf);
  pIVar7 = q3->next;
  if ((pIVar7->itemtype == 0x143) && (iVar6 = strcmp((pIVar7->element).str,"double"), iVar6 == 0)) {
    do {
      do {
        pIVar7 = pIVar7->next;
      } while (pIVar7->itemtype != 0x143);
      iVar6 = strcmp((pIVar7->element).str,";\n");
    } while (iVar6 != 0);
    pIVar7 = pIVar7->next;
  }
  insertstr(pIVar7,"double b_flux, f_flux, _term; int _i;\n");
  lVar8 = 0x41;
  do {
    pLVar14 = symlist[lVar8];
    for (pLVar18 = pLVar14->next; pLVar18 != pLVar14; pLVar18 = pLVar18->next) {
      pIVar3 = (pLVar18->element).itm;
      if (((pIVar3->itemtype == 0x13e) && (((ulong)pIVar3->element & 0x10) != 0)) &&
         (*(int *)&pIVar3[1].next != 0)) {
        *(undefined4 *)&pIVar3[1].next = 0;
      }
    }
    lVar8 = lVar8 + 1;
    pRVar9 = conslist;
  } while (lVar8 != 0x7b);
  for (; pRVar10 = reactlist, pRVar9 != (Reaction *)0x0; pRVar9 = pRVar9->reactnext) {
    for (pRVar16 = pRVar9->rterm[0]; pRVar16 != (Rterm *)0x0; pRVar16 = pRVar16->rnext) {
      if (pRVar16->isstate != 0) {
        pRVar16->sym->used = -1;
      }
    }
  }
  for (; pRVar10 != (Reaction *)0x0; pRVar10 = pRVar10->reactnext) {
    for (pRVar16 = pRVar10->rterm[0]; pRVar16 != (Rterm *)0x0; pRVar16 = pRVar16->rnext) {
      if (pRVar16->isstate != 0) {
        pRVar16->sym->used = -1;
      }
    }
    for (pRVar16 = pRVar10->rterm[1]; pRVar16 != (Rterm *)0x0; pRVar16 = pRVar16->rnext) {
      if (pRVar16->isstate != 0) {
        pRVar16->sym->used = -1;
      }
    }
  }
  if (conslist == (Reaction *)0x0) {
    uVar20 = 0;
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    uVar20 = 0;
    pRVar9 = conslist;
    do {
      for (pRVar16 = pRVar9->rterm[0]; pRVar16 != (Rterm *)0x0; pRVar16 = pRVar16->rnext) {
        pSVar4 = pRVar16->sym;
        if ((pSVar4->used == -1) && ((pSVar4->subtype & 0x20) == 0)) {
          pSVar4->varnum = iVar6;
          iVar6 = iVar6 + 1;
          uVar20 = uVar20 + 1;
          pSVar4->used = uVar20;
          break;
        }
      }
      if (pRVar16 == (Rterm *)0x0) {
        diag("Failed to diagonalize the Kinetic matrix",(char *)0x0);
      }
      pRVar9 = pRVar9->reactnext;
    } while (pRVar9 != (Reaction *)0x0);
  }
  lVar8 = 0x41;
  array_length = iVar6;
  do {
    pLVar14 = symlist[lVar8];
    for (pLVar18 = pLVar14->next; pLVar18 != pLVar14; pLVar18 = pLVar18->next) {
      pIVar3 = (pLVar18->element).itm;
      if (((pIVar3->itemtype == 0x13e) &&
          (pIVar5 = (pIVar3->element).itm, ((ulong)pIVar5 & 0x10) != 0)) &&
         (*(int *)&pIVar3[1].next == -1)) {
        *(int *)(pIVar3 + 2) = array_length;
        uVar20 = uVar20 + 1;
        *(uint *)&pIVar3[1].next = uVar20;
        if (((ulong)pIVar5 & 0x20) == 0) {
          array_length = array_length + 1;
        }
        else {
          array_length = array_length + *(int *)&pIVar3[1].prev;
        }
      }
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x7b);
  if (array_length != 0) {
    pSVar2->used = array_length;
    sprintf(buf,"_slist%d",(ulong)(uint)numlist);
    add_global_var("int",buf,0,1,array_length,1);
    sprintf(buf,"_dlist%d",(ulong)(uint)numlist);
    add_global_var("int",buf,0,1,array_length,1);
    insertstr(q4,"  } return _reset;\n");
    movelist(q1,q4,procfunc);
    pRVar11 = (Rlist *)emalloc(0x50);
    pRVar11->reaction = reactlist;
    reactlist = (Reaction *)0x0;
    pRVar11->sens_parm = sens_parm;
    ppSVar12 = (Symbol **)emalloc(uVar20 * 8);
    pRVar11->symorder = ppSVar12;
    pRVar11->slist_decl = 0;
    lVar8 = 0x41;
    do {
      pLVar14 = symlist[lVar8]->next;
      if (pLVar14 != symlist[lVar8]) {
        do {
          pSVar4 = (pLVar14->element).sym;
          if ((((pSVar4->type == 0x13e) && ((pSVar4->subtype & 0x10) != 0)) &&
              ((long)pSVar4->used != 0)) &&
             (pRVar11->symorder[(long)pSVar4->used + -1] = pSVar4, sensused != 0)) {
            add_sens_statelist(pSVar4);
          }
          pLVar14 = pLVar14->next;
        } while (pLVar14 != symlist[lVar8]);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x7b);
    pRVar11->nsym = uVar20;
    pRVar11->ncons = iVar6;
    pRVar11->position = pIVar7;
    pRVar11->endbrace = q4->prev;
    if (sensused != 0) {
      sensmassage(0x10a,q2,numlist);
    }
    pRVar11->sym = pSVar2;
    pRVar11->rlistnext = rlist;
    rlist = pRVar11;
    pRVar11 = (Rlist *)emalloc(0x50);
    pRVar11->reaction = conslist;
    conslist = (Reaction *)0x0;
    pRVar11->sym = pSVar2;
    pRVar11->rlistnext = clist;
    clist = pRVar11;
    ppcVar13 = (char **)emalloc(uVar20 * 8);
    rlist->capacity = ppcVar13;
    pRVar11 = rlist;
    if (0 < (int)uVar20) {
      uVar17 = 0;
      do {
        pRVar11->capacity[uVar17] = "";
        uVar17 = uVar17 + 1;
      } while (uVar20 != uVar17);
    }
    if (compartlist != (List *)0x0) {
      pLVar14 = compartlist->next;
      if (pLVar14 != compartlist) {
        do {
          pIVar7 = (pLVar14->next->element).itm;
          pIVar3 = pLVar14->next->next;
          pIVar5 = (pIVar3->element).itm;
          pIVar19 = pIVar7->next;
          if (pIVar19 != pIVar5) {
            q1_00 = (pLVar14->element).itm;
            do {
              pcVar15 = qconcat(q1_00,pIVar7->prev);
              sprintf(local_2038,"(%s)",pcVar15);
              pcVar15 = stralloc(local_2038,(char *)0x0);
              rlist->capacity[(long)((pIVar19->element).sym)->used + -1] = pcVar15;
              pIVar19 = pIVar19->next;
            } while (pIVar19 != pIVar5);
          }
          pLVar14 = pIVar3->next;
        } while (pLVar14 != compartlist);
      }
      freelist(&compartlist);
    }
    lVar8 = 0x41;
    do {
      pLVar14 = symlist[lVar8];
      for (pLVar18 = pLVar14->next; pLVar18 != pLVar14; pLVar18 = pLVar18->next) {
        pIVar7 = (pLVar18->element).itm;
        if (((pIVar7->itemtype == 0x13e) && (((ulong)pIVar7->element & 0x10) != 0)) &&
           (*(int *)&pIVar7[1].next != 0)) {
          *(undefined4 *)&pIVar7[1].next = 0;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x7b);
    cvode_sbegin = q3;
    cvode_send = q4;
    kin_items_ = newlist();
    for (pIVar7 = cvode_sbegin; pIVar7 != cvode_send->next; pIVar7 = pIVar7->next) {
      lappenditem(kin_items_,pIVar7);
    }
    return;
  }
  diag("KINETIC contains no reactions",(char *)0x0);
}

Assistant:

void massagekinetic(q1, q2, q3, q4, sensused) /*KINETIC NAME stmtlist '}'*/
	Item *q1, *q2, *q3,*q4;
	int sensused;
{
	int count = 0, i, order, ncons;
	Item *q, *qs, *afterbrace;
	Item* qv;
	Symbol *s, *fun;
	Reaction *r1;
	Rterm *rt;
	Rlist *r;
	
	fun = SYM(q2);
	if ((fun->subtype & (DERF|KINF)) && fun->u.i) {
		diag("Merging kinetic blocks not implemented", (char *)0);
	}
	fun->subtype |= KINF;
	numlist++;
	fun->u.i = numlist;
	
#if 0
	Sprintf(buf, "static int %s();\n", SYM(q2)->name);
	Linsertstr(procfunc, buf);
	replacstr(q1, "\nstatic int");
#else
	Sprintf(buf,
	  "\n"
	  "/* _kinetic_ %s %s */\n"
	  "#ifndef INSIDE_NMODL\n"
	  "#define INSIDE_NMODL\n"
	  "#endif\n"
	  , SYM(q2)->name, suffix);
	Linsertstr(procfunc, buf);
	Sprintf(buf, "\ntemplate <coreneuron::scopmath::enabled_code code_to_enable = coreneuron::scopmath::enabled_code::all>\nstruct %s%s {\n  int operator()(SparseObj* _so, double* _rhs, _threadargsproto_) const;\n};\ntemplate <coreneuron::scopmath::enabled_code code_to_enable>\nint", SYM(q2)->name, suffix);
	replacstr(q1, buf);
	Sprintf(buf, "%s%s<code_to_enable>::operator()", SYM(q2)->name, suffix);
	replacstr(q2, buf);
#endif
	qv = insertstr(q3, "()\n");
#if VECTORIZE
if (vectorize) {
	kin_vect1(q1, q2, q4);
	vectorize_substitute(qv, "(SparseObj* _so, double* _rhs, _threadargsproto_) const\n");
}
#endif
	qv = insertstr(q3, "{_reset=0;\n");
#if VECTORIZE
Sprintf(buf, "{int _reset=0;\n");
	vectorize_substitute(qv, buf);
#endif
	afterbrace = q3->next;
#if Glass
 	/* Make sure that if the next statement was LOCAL xxx, we skip
 	past it to do any of the other declarations. DRB */
 	if(afterbrace->itemtype==STRING &&
 		!strcmp(afterbrace->element.str,"double")){
 		for(afterbrace = afterbrace->next ;
 			afterbrace->itemtype!=STRING ||
 			strcmp(afterbrace->element.str,";\n") ;
 			afterbrace=afterbrace->next);
 		if(afterbrace->itemtype==STRING &&
 		!strcmp(afterbrace->element.str,";\n"))
 			afterbrace=afterbrace->next;
 		}

#endif
	qv = insertstr(afterbrace, "double b_flux, f_flux, _term; int _i;\n");
#if 0 && VECTORIZE
	vectorize_substitute(qv, "int _i;\n");
#endif
	/* also after these declarations will go initilization statements */
	
	order = 0;
	/* the varnum and order of the states is such that diagonals of
	conservation equations must be first.  This is done by setting
	s->used=-1 for all states and then numbering first with respect
	to the conslist and then the remaining that are still -1
	*/
	/* mark only the isstate states */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			s->used = 0;
		}
	}
	for (r1 = conslist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
	}
	for (r1 = reactlist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
		for (rt = r1->rterm[1]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
	}

	/* diagonals of the conservation relations are first */
	for (r1 = conslist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
		   if ((rt->sym->used == -1) && !(rt->sym->subtype & ARRAY)) {
				rt->sym->varnum = count++;
				rt->sym->used = ++order; /*first is 1*/
				break;
		   }
		}
		if (!rt) {
		   diag("Failed to diagonalize the Kinetic matrix", (char *)0);
		}
	}
	ncons = count; /* can't use array as conservation diagonal */
	/* others can be in any order */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used == -1) {
			s->varnum = count;
			s->used = ++order; /* count and order  distinct states */
			if (s->subtype & ARRAY) { int dim = s->araydim;
				count += dim;
			}else{
				count++;
			}
		}
	}
	if (count == 0) {
		diag("KINETIC contains no reactions", (char *)0);
	}
	fun->used = count;

	Sprintf(buf, "_slist%d", numlist);
	add_global_var("int", buf, 0, 1, count, 1);
	Sprintf(buf, "_dlist%d", numlist);
	add_global_var("int", buf, 0, 1, count, 1);

	insertstr(q4, "  } return _reset;\n");
	movelist(q1, q4, procfunc);

	r = (Rlist *)emalloc(sizeof(Rlist));
	r->reaction = reactlist;
	reactlist = (Reaction *)0;
	r->sens_parm = sens_parm;
	r->symorder = (Symbol **)emalloc((unsigned)order*sizeof(Symbol *));
	r->slist_decl = 0;
	/*the reason that we can't just keep this info in s->varnum is that
	more than one block can have the same state with a different varnum */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			r->symorder[s->used - 1] = s;
			if (sensused) {
				add_sens_statelist(s);
			}
		}
	}
	r->nsym = order;
	r->ncons = ncons;
	r->position = afterbrace;
	r->endbrace = q4->prev;	/* needed for Dstate with COMPARTMENT */
	if (sensused) {
		/* fun now is the interface and fun->used is all the states */
		sensmassage(DERIVATIVE, q2, numlist);
		/* this sets sens_parm to 0 */
	}
	r->sym = fun;
	r->rlistnext = rlist;
	rlist = r;
	r = (Rlist *)emalloc(sizeof(Rlist));
	r->reaction = conslist;
	conslist = (Reaction *)0;
	r->sym = fun;
	r->rlistnext = clist;
	clist = r;

	/* handle compartlist if any */
	rlist->capacity = (char **)emalloc((unsigned)order*sizeof(char *));
	for (i=0; i<order; i++) {
		rlist->capacity[i] = "";
	}
	if (compartlist) {
		char buf1[NRN_BUFSIZE];
		Item *q, *qexp, *qb, *qend, *q1;
		ITERATE(q, compartlist) {
			qexp = ITM(q); q = q->next;
			qb = ITM(q); q = q->next;
			qend = ITM(q);
			for (q1 = qb->next; q1 != qend; q1 = q1->next) {
				Sprintf(buf1, "(%s)", qconcat(qexp, qb->prev));
rlist->capacity[SYM(q1)->used - 1] = stralloc(buf1, (char *)0);
			}
		}
		freelist(&compartlist);
	}

	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			s->used = 0;
		}
	}
#if CVODE
	cvode_sbegin = q3;
	cvode_send = q4;
	kin_items_ = newlist();
	for (q = cvode_sbegin; q != cvode_send->next; q = q->next) {
		lappenditem(kin_items_, q);
	}
#endif
}